

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

void duckdb::TernaryExecutor::
     ExecuteLoop<bool,bool,bool,bool,duckdb::TernaryLambdaWrapper,bool(*)(bool,bool,bool)>
               (bool *adata,bool *bdata,bool *cdata,bool *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,_func_bool_bool_bool_bool *fun)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t row_idx;
  idx_t row_idx_00;
  idx_t row_idx_01;
  idx_t i;
  ulong uVar5;
  idx_t row_idx_02;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
      uVar2 = uVar5;
      if (*(long *)asel != 0) {
        uVar2 = (ulong)*(uint *)(*(long *)asel + uVar5 * 4);
      }
      uVar3 = uVar5;
      if (*(long *)bsel != 0) {
        uVar3 = (ulong)*(uint *)(*(long *)bsel + uVar5 * 4);
      }
      uVar4 = uVar5;
      if (*(long *)csel != 0) {
        uVar4 = (ulong)*(uint *)(*(long *)csel + uVar5 * 4);
      }
      bVar1 = (*fun)(adata[uVar2],bdata[uVar3],cdata[uVar4]);
      result_data[uVar5] = bVar1;
    }
  }
  else {
    for (row_idx_02 = 0; count != row_idx_02; row_idx_02 = row_idx_02 + 1) {
      row_idx_00 = row_idx_02;
      if (*(long *)asel != 0) {
        row_idx_00 = (idx_t)*(uint *)(*(long *)asel + row_idx_02 * 4);
      }
      row_idx_01 = row_idx_02;
      if (*(long *)bsel != 0) {
        row_idx_01 = (idx_t)*(uint *)(*(long *)bsel + row_idx_02 * 4);
      }
      row_idx = row_idx_02;
      if (*(long *)csel != 0) {
        row_idx = (idx_t)*(uint *)(*(long *)csel + row_idx_02 * 4);
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&avalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&bvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
        if (!bVar1) goto LAB_002a1afd;
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&cvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
        if (!bVar1) goto LAB_002a1afd;
        bVar1 = (*fun)(adata[row_idx_00],bdata[row_idx_01],cdata[row_idx]);
        result_data[row_idx_02] = bVar1;
      }
      else {
LAB_002a1afd:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx_02);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}